

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O3

void __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
decref(SignalLink *this)

{
  int *piVar1;
  _Manager_type p_Var2;
  
  piVar1 = &this->ref_count;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  p_Var2 = (this->function).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->function,(_Any_data *)&this->function,__destroy_functor);
  }
  operator_delete(this);
  return;
}

Assistant:

void decref() {
      ref_count -= 1;
      if (!ref_count)
        delete this;
      else
        assert(ref_count > 0);
    }